

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O0

int Test_SUNLinSolResNorm(SUNLinearSolver S,int myid)

{
  double dVar1;
  realtype rVar2;
  double dVar3;
  double resnorm;
  double stop_time;
  double start_time;
  int myid_local;
  SUNLinearSolver S_local;
  
  dVar1 = get_time();
  rVar2 = SUNLinSolResNorm(S);
  dVar3 = get_time();
  if (0.0 <= rVar2) {
    if ((myid == 0) && (printf("    PASSED test -- SUNLinSolResNorm\n"), print_time != 0)) {
      printf("    SUNLinSolResNorm Time: %22.15e \n \n",dVar3 - dVar1);
    }
    S_local._4_4_ = 0;
  }
  else {
    printf(">>> FAILED test -- SUNLinSolResNorm returned %g on Proc %d \n",rVar2,(ulong)(uint)myid);
    S_local._4_4_ = 1;
  }
  return S_local._4_4_;
}

Assistant:

int Test_SUNLinSolResNorm(SUNLinearSolver S, int myid)
{
  double start_time, stop_time, resnorm;

  /* this test can fail if the function is NULL, which will cause a seg-fault */
  start_time = get_time();   
  resnorm = (double) SUNLinSolResNorm(S);
  stop_time = get_time();   

  /* this test can also fail if the return value is negative */
  if (resnorm < ZERO){
    printf(">>> FAILED test -- SUNLinSolResNorm returned %g on Proc %d \n", 
           resnorm, myid);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNLinSolResNorm\n");
    PRINT_TIME("    SUNLinSolResNorm Time: %22.15e \n \n", stop_time - start_time);
  }

  return(0);
}